

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::InstancedRenderingCase::init
          (InstancedRenderingCase *this,EVP_PKEY_CTX *ctx)

{
  int *value;
  vector<float,_std::allocator<float>_> *this_00;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_01;
  DataType dataType;
  RenderContext *renderCtx;
  short sVar1;
  InstancingType IVar2;
  char *__s;
  ShaderProgram *this_02;
  TestError *this_03;
  ulong uVar3;
  int precision;
  int precision_00;
  int precision_01;
  int precision_02;
  int y;
  int iVar4;
  int iVar5;
  int x;
  int iVar6;
  bool *__s_00;
  string *psVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  string vertShaderSourceStr;
  float fy;
  float fy0;
  float local_34c;
  float fy1;
  int local_328;
  int local_324;
  float fx;
  string swizzleFirst;
  string numInstancesStr;
  string floatUintBiasStr;
  string floatUintScaleStr;
  string floatIntBiasStr;
  string colorBExpression;
  string colorGExpression;
  string colorRExpression;
  string posExpression;
  string instanceAttribs;
  string floatIntScaleStr;
  string typeName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  dataType = this->m_rgbAttrType;
  bVar10 = dataType - TYPE_FLOAT_MAT2 < 9;
  bVar11 = dataType - TYPE_DOUBLE_MAT2 < 9;
  local_328 = glu::getDataTypeScalarSize(dataType);
  __s_00 = (bool *)0x1841098;
  if (local_328 == 1) {
    __s_00 = glcts::fixed_sample_locations_values + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&swizzleFirst,__s_00,(allocator<char> *)&fx);
  __s = glu::getDataTypeName(this->m_rgbAttrType);
  std::__cxx11::string::string<std::allocator<char>>((string *)&typeName,__s,(allocator<char> *)&fx)
  ;
  de::floatToString_abi_cxx11_(&floatIntBiasStr,(de *)0x3,100.0,precision);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,"(",
                 &floatIntBiasStr);
  std::operator+(&floatIntScaleStr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,")");
  std::__cxx11::string::~string((string *)&fx);
  std::__cxx11::string::~string((string *)&floatIntBiasStr);
  de::floatToString_abi_cxx11_(&floatUintScaleStr,(de *)0x3,-50.0,precision_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,"(",
                 &floatUintScaleStr);
  std::operator+(&floatIntBiasStr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,")");
  std::__cxx11::string::~string((string *)&fx);
  std::__cxx11::string::~string((string *)&floatUintScaleStr);
  de::floatToString_abi_cxx11_(&floatUintBiasStr,(de *)0x3,100.0,precision_01);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,"(",
                 &floatUintBiasStr);
  std::operator+(&floatUintScaleStr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,")");
  std::__cxx11::string::~string((string *)&fx);
  std::__cxx11::string::~string((string *)&floatUintBiasStr);
  de::floatToString_abi_cxx11_(&numInstancesStr,(de *)0x3,0.0,precision_02);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,"(",
                 &numInstancesStr);
  std::operator+(&floatUintBiasStr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,")");
  std::__cxx11::string::~string((string *)&fx);
  std::__cxx11::string::~string((string *)&numInstancesStr);
  value = &this->m_numInstances;
  de::toString<int>((string *)&fx,value);
  std::operator+(&numInstancesStr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,".0");
  std::__cxx11::string::~string((string *)&fx);
  instanceAttribs._M_dataplus._M_p = (pointer)&instanceAttribs.field_2;
  instanceAttribs._M_string_length = 0;
  instanceAttribs.field_2._M_local_buf[0] = '\0';
  posExpression._M_dataplus._M_p = (pointer)&posExpression.field_2;
  posExpression._M_string_length = 0;
  colorRExpression._M_dataplus._M_p = (pointer)&colorRExpression.field_2;
  colorRExpression._M_string_length = 0;
  posExpression.field_2._M_local_buf[0] = '\0';
  colorRExpression.field_2._M_local_buf[0] = '\0';
  colorGExpression._M_dataplus._M_p = (pointer)&colorGExpression.field_2;
  colorGExpression._M_string_length = 0;
  colorBExpression._M_dataplus._M_p = (pointer)&colorBExpression.field_2;
  colorBExpression._M_string_length = 0;
  colorGExpression.field_2._M_local_buf[0] = '\0';
  colorBExpression.field_2._M_local_buf[0] = '\0';
  IVar2 = this->m_instancingType;
  if ((IVar2 & ~TYPE_MIXED) == TYPE_INSTANCE_ID) {
    std::operator+(&vertShaderSourceStr,"a_position + vec4(float(gl_InstanceID) * 2.0 / ",
                   &numInstancesStr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                   &vertShaderSourceStr,", 0.0, 0.0, 0.0)");
    std::__cxx11::string::operator=((string *)&posExpression,(string *)&fx);
    std::__cxx11::string::~string((string *)&fx);
    std::__cxx11::string::~string((string *)&vertShaderSourceStr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                   "float(gl_InstanceID)/",&numInstancesStr);
    std::__cxx11::string::operator=((string *)&colorRExpression,(string *)&fx);
    std::__cxx11::string::~string((string *)&fx);
    IVar2 = this->m_instancingType;
    if (IVar2 == TYPE_INSTANCE_ID) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                     "float(gl_InstanceID)*2.0/",&numInstancesStr);
      std::__cxx11::string::operator=((string *)&colorGExpression,(string *)&fx);
      std::__cxx11::string::~string((string *)&fx);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                     "1.0 - float(gl_InstanceID)/",&numInstancesStr);
      std::__cxx11::string::operator=((string *)&colorBExpression,(string *)&fx);
      std::__cxx11::string::~string((string *)&fx);
      IVar2 = this->m_instancingType;
    }
  }
  uVar3 = (ulong)(IVar2 - TYPE_ATTRIB_DIVISOR);
  if (1 < IVar2 - TYPE_ATTRIB_DIVISOR) goto LAB_01061445;
  if (IVar2 == TYPE_ATTRIB_DIVISOR) {
    std::__cxx11::string::assign((char *)&posExpression);
    std::__cxx11::string::append((char *)&posExpression);
    std::__cxx11::string::append((char *)&posExpression);
    if (dataType - TYPE_FLOAT < 4) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                     "a_instanceR",&swizzleFirst);
      psVar7 = (string *)&fx;
      std::__cxx11::string::operator=((string *)&colorRExpression,psVar7);
LAB_01060f29:
      std::__cxx11::string::~string(psVar7);
    }
    else {
      if (dataType - TYPE_INT < 4) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,
                       "(float(a_instanceR",&swizzleFirst);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,
                       ") - ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                       &floatIntBiasStr);
        std::operator+(&vertShaderSourceStr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,
                       ") / ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                       &vertShaderSourceStr,&floatIntScaleStr);
LAB_01060ee3:
        std::__cxx11::string::operator=((string *)&colorRExpression,(string *)&fx);
        std::__cxx11::string::~string((string *)&fx);
        std::__cxx11::string::~string((string *)&vertShaderSourceStr);
        std::__cxx11::string::~string((string *)&fy);
        std::__cxx11::string::~string((string *)&fy0);
        psVar7 = (string *)&fy1;
        goto LAB_01060f29;
      }
      if (dataType - TYPE_UINT < 4) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,
                       "(float(a_instanceR",&swizzleFirst);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,
                       ") - ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                       &floatUintBiasStr);
        std::operator+(&vertShaderSourceStr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,
                       ") / ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                       &vertShaderSourceStr,&floatUintScaleStr);
        goto LAB_01060ee3;
      }
      if (bVar10 || bVar11) {
        std::__cxx11::string::assign((char *)&colorRExpression);
      }
    }
    de::toString<int>((string *)&fy0,&OFFSET_COMPONENTS);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,"vec",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0);
    std::operator+(&vertShaderSourceStr,"in highp ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                   &vertShaderSourceStr," a_instanceOffset;\n");
    std::__cxx11::string::append((string *)&instanceAttribs);
    std::__cxx11::string::~string((string *)&fx);
    std::__cxx11::string::~string((string *)&vertShaderSourceStr);
    std::__cxx11::string::~string((string *)&fy);
    std::__cxx11::string::~string((string *)&fy0);
    std::operator+(&vertShaderSourceStr,"in mediump ",&typeName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                   &vertShaderSourceStr," a_instanceR;\n");
    std::__cxx11::string::append((string *)&instanceAttribs);
    std::__cxx11::string::~string((string *)&fx);
    std::__cxx11::string::~string((string *)&vertShaderSourceStr);
  }
  if (dataType - TYPE_FLOAT < 4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                   "a_instanceG",&swizzleFirst);
    std::__cxx11::string::operator=((string *)&colorGExpression,(string *)&fx);
    std::__cxx11::string::~string((string *)&fx);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                   "a_instanceB",&swizzleFirst);
    psVar7 = (string *)&fx;
    std::__cxx11::string::operator=((string *)&colorBExpression,psVar7);
LAB_01061384:
    std::__cxx11::string::~string(psVar7);
  }
  else {
    if (dataType - TYPE_INT < 4) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,
                     "(float(a_instanceG",&swizzleFirst);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,
                     ") - ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                     &floatIntBiasStr);
      std::operator+(&vertShaderSourceStr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,") / "
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                     &vertShaderSourceStr,&floatIntScaleStr);
      std::__cxx11::string::operator=((string *)&colorGExpression,(string *)&fx);
      std::__cxx11::string::~string((string *)&fx);
      std::__cxx11::string::~string((string *)&vertShaderSourceStr);
      std::__cxx11::string::~string((string *)&fy);
      std::__cxx11::string::~string((string *)&fy0);
      std::__cxx11::string::~string((string *)&fy1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,
                     "(float(a_instanceB",&swizzleFirst);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,
                     ") - ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                     &floatIntBiasStr);
      std::operator+(&vertShaderSourceStr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,") / "
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                     &vertShaderSourceStr,&floatIntScaleStr);
LAB_0106133e:
      std::__cxx11::string::operator=((string *)&colorBExpression,(string *)&fx);
      std::__cxx11::string::~string((string *)&fx);
      std::__cxx11::string::~string((string *)&vertShaderSourceStr);
      std::__cxx11::string::~string((string *)&fy);
      std::__cxx11::string::~string((string *)&fy0);
      psVar7 = (string *)&fy1;
      goto LAB_01061384;
    }
    if (dataType - TYPE_UINT < 4) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,
                     "(float(a_instanceG",&swizzleFirst);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,
                     ") - ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                     &floatUintBiasStr);
      std::operator+(&vertShaderSourceStr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,") / "
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                     &vertShaderSourceStr,&floatUintScaleStr);
      std::__cxx11::string::operator=((string *)&colorGExpression,(string *)&fx);
      std::__cxx11::string::~string((string *)&fx);
      std::__cxx11::string::~string((string *)&vertShaderSourceStr);
      std::__cxx11::string::~string((string *)&fy);
      std::__cxx11::string::~string((string *)&fy0);
      std::__cxx11::string::~string((string *)&fy1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,
                     "(float(a_instanceB",&swizzleFirst);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,
                     ") - ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                     &floatUintBiasStr);
      std::operator+(&vertShaderSourceStr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,") / "
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                     &vertShaderSourceStr,&floatUintScaleStr);
      goto LAB_0106133e;
    }
    if (bVar10 || bVar11) {
      std::__cxx11::string::assign((char *)&colorGExpression);
      std::__cxx11::string::assign((char *)&colorBExpression);
    }
  }
  std::operator+(&vertShaderSourceStr,"in mediump ",&typeName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                 &vertShaderSourceStr," a_instanceG;\n");
  std::__cxx11::string::append((string *)&instanceAttribs);
  std::__cxx11::string::~string((string *)&fx);
  std::__cxx11::string::~string((string *)&vertShaderSourceStr);
  std::operator+(&vertShaderSourceStr,"in mediump ",&typeName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                 &vertShaderSourceStr," a_instanceB;\n");
  std::__cxx11::string::append((string *)&instanceAttribs);
  std::__cxx11::string::~string((string *)&fx);
  std::__cxx11::string::~string((string *)&vertShaderSourceStr);
LAB_01061445:
  std::operator+(&local_d0,"#version 300 es\nin highp vec4 a_position;\n",&instanceAttribs);
  std::operator+(&local_b0,&local_d0,"out mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_Position = "
                );
  std::operator+(&local_90,&local_b0,&posExpression);
  std::operator+(&local_70,&local_90,";\n\tv_color.r = ");
  std::operator+(&local_50,&local_70,&colorRExpression);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,&local_50
                 ,";\n\tv_color.g = ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy1,
                 &colorGExpression);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy0,
                 ";\n\tv_color.b = ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fy,
                 &colorBExpression);
  std::operator+(&vertShaderSourceStr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fx,
                 ";\n\tv_color.a = 1.0;\n}\n");
  std::__cxx11::string::~string((string *)&fx);
  std::__cxx11::string::~string((string *)&fy);
  std::__cxx11::string::~string((string *)&fy0);
  std::__cxx11::string::~string((string *)&fy1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  this_02 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fy,
             "#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\nin mediump vec4 v_color;\n\nvoid main()\n{\n\to_color = v_color;\n}\n"
             ,(allocator<char> *)&fy0);
  glu::makeVtxFragSources((ProgramSources *)&fx,&vertShaderSourceStr,(string *)&fy);
  glu::ShaderProgram::ShaderProgram(this_02,renderCtx,(ProgramSources *)&fx);
  this->m_program = this_02;
  glu::ProgramSources::~ProgramSources((ProgramSources *)&fx);
  std::__cxx11::string::~string((string *)&fy);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    this_03 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_03,"Failed to compile shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fInstancedRenderingTests.cpp"
               ,0x136);
    __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = &this->m_gridVertexPositions;
  if (this->m_function == FUNCTION_DRAW_ELEMENTS_INSTANCED) {
    for (iVar4 = 0; iVar4 != 0x80; iVar4 = iVar4 + 1) {
      for (iVar6 = 0; iVar6 != 0x80; iVar6 = iVar6 + 1) {
        fx = ((float)iVar6 / 127.0 + (float)iVar6 / 127.0) / (float)*value + -1.0;
        fy = (float)iVar4 / 127.0 + (float)iVar4 / 127.0 + -1.0;
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fx);
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fy);
      }
    }
    this_01 = &this->m_gridIndices;
    uVar3 = CONCAT62((int6)(uVar3 >> 0x10),0x81);
    for (iVar4 = 0; iVar4 != 0x7f; iVar4 = iVar4 + 1) {
      local_34c = (float)uVar3;
      uVar3 = uVar3 & 0xffffffff;
      iVar6 = 0x7f;
      while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
        sVar1 = (short)uVar3;
        fx = (float)CONCAT22(fx._2_2_,sVar1 + -0x81);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (this_01,(unsigned_short *)&fx);
        fx = (float)CONCAT22(fx._2_2_,sVar1 + -0x80);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (this_01,(unsigned_short *)&fx);
        fx = (float)CONCAT22(fx._2_2_,sVar1 + -1);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (this_01,(unsigned_short *)&fx);
        fx = (float)CONCAT22(fx._2_2_,sVar1);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (this_01,(unsigned_short *)&fx);
        fx = (float)CONCAT22(fx._2_2_,sVar1 + -1);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (this_01,(unsigned_short *)&fx);
        fx = (float)CONCAT22(fx._2_2_,sVar1 + -0x80);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (this_01,(unsigned_short *)&fx);
        uVar3 = (ulong)((int)uVar3 + 1);
      }
      uVar3 = (ulong)((int)local_34c + 0x80);
    }
  }
  else {
    iVar4 = 0;
    while (iVar4 != 0x7f) {
      fVar13 = (float)iVar4;
      local_324 = iVar4 + 1;
      local_34c = (float)local_324 / 127.0 + (float)local_324 / 127.0 + -1.0;
      for (iVar6 = 1; iVar4 = local_324, iVar6 != 0x80; iVar6 = iVar6 + 1) {
        fVar12 = (float)(iVar6 + -1) / 127.0;
        fx = (fVar12 + fVar12) / (float)*value + -1.0;
        fy = ((float)iVar6 / 127.0 + (float)iVar6 / 127.0) / (float)*value + -1.0;
        fy1 = local_34c;
        fy0 = fVar13 / 127.0 + fVar13 / 127.0 + -1.0;
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fx);
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fy0);
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fy);
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fy0);
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fx);
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fy1);
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fy);
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fy1);
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fx);
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fy1);
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fy);
        std::vector<float,_std::allocator<float>_>::push_back(this_00,&fy0);
      }
    }
  }
  if (this->m_instancingType - TYPE_ATTRIB_DIVISOR < 2) {
    if (this->m_instancingType == TYPE_ATTRIB_DIVISOR) {
      for (iVar4 = 0; iVar6 = *value, iVar4 < iVar6; iVar4 = iVar4 + 1) {
        fx = ((float)iVar4 + (float)iVar4) / (float)iVar6;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>
                  (&this->m_instanceOffsets,&fx);
        iVar6 = 2;
        while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
          fx = 0.0;
          std::vector<float,_std::allocator<float>_>::emplace_back<float>
                    (&this->m_instanceOffsets,&fx);
        }
      }
      iVar6 = (iVar6 / 3 + 1) - (uint)(iVar6 % 3 == 0);
      fVar13 = (float)iVar6;
      iVar4 = local_328 + -1;
      if (local_328 + -1 < 1) {
        iVar4 = 0;
      }
      iVar5 = 0;
      if (iVar6 < 1) {
        iVar6 = 0;
        iVar5 = 0;
      }
      for (; iVar5 != iVar6; iVar5 = iVar5 + 1) {
        pushVarCompAttrib(this,&this->m_instanceColorR,(float)iVar5 / fVar13);
        iVar9 = iVar4;
        while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
          pushVarCompAttrib(this,&this->m_instanceColorR,0.0);
        }
      }
    }
    else {
      iVar4 = 0;
      if (0 < local_328 + -1) {
        iVar4 = local_328 + -1;
      }
    }
    iVar5 = (this->m_numInstances & 1U) + this->m_numInstances / 2;
    fVar13 = (float)iVar5;
    iVar6 = 0;
    if (iVar5 < 1) {
      iVar5 = 0;
      iVar6 = 0;
    }
    for (; iVar6 != iVar5; iVar6 = iVar6 + 1) {
      pushVarCompAttrib(this,&this->m_instanceColorG,((float)iVar6 + (float)iVar6) / fVar13);
      iVar9 = iVar4;
      while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
        pushVarCompAttrib(this,&this->m_instanceColorG,0.0);
      }
    }
    iVar6 = this->m_numInstances;
    iVar9 = 0;
    iVar5 = iVar6;
    if (iVar6 < 1) {
      iVar5 = iVar9;
    }
    for (; iVar9 != iVar5; iVar9 = iVar9 + 1) {
      pushVarCompAttrib(this,&this->m_instanceColorB,1.0 - (float)iVar9 / (float)iVar6);
      iVar8 = iVar4;
      while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
        pushVarCompAttrib(this,&this->m_instanceColorB,0.0);
      }
    }
  }
  std::__cxx11::string::~string((string *)&vertShaderSourceStr);
  std::__cxx11::string::~string((string *)&colorBExpression);
  std::__cxx11::string::~string((string *)&colorGExpression);
  std::__cxx11::string::~string((string *)&colorRExpression);
  std::__cxx11::string::~string((string *)&posExpression);
  std::__cxx11::string::~string((string *)&instanceAttribs);
  std::__cxx11::string::~string((string *)&numInstancesStr);
  std::__cxx11::string::~string((string *)&floatUintBiasStr);
  std::__cxx11::string::~string((string *)&floatUintScaleStr);
  std::__cxx11::string::~string((string *)&floatIntBiasStr);
  std::__cxx11::string::~string((string *)&floatIntScaleStr);
  std::__cxx11::string::~string((string *)&typeName);
  iVar4 = std::__cxx11::string::~string((string *)&swizzleFirst);
  return iVar4;
}

Assistant:

void InstancedRenderingCase::init (void)
{
	bool	isFloatCase			= glu::isDataTypeFloatOrVec(m_rgbAttrType);
	bool	isIntCase			= glu::isDataTypeIntOrIVec(m_rgbAttrType);
	bool	isUintCase			= glu::isDataTypeUintOrUVec(m_rgbAttrType);
	bool	isMatCase			= glu::isDataTypeMatrix(m_rgbAttrType);
	int		typeSize			= glu::getDataTypeScalarSize(m_rgbAttrType);
	bool	isScalarCase		= typeSize == 1;
	string	swizzleFirst		= isScalarCase ? "" : ".x";
	string	typeName			= glu::getDataTypeName(m_rgbAttrType);

	string	floatIntScaleStr	= "(" + de::floatToString(FLOAT_INT_SCALE, 3) + ")";
	string	floatIntBiasStr		= "(" + de::floatToString(FLOAT_INT_BIAS, 3) + ")";
	string	floatUintScaleStr	= "(" + de::floatToString(FLOAT_UINT_SCALE, 3) + ")";
	string	floatUintBiasStr	= "(" + de::floatToString(FLOAT_UINT_BIAS, 3) + ")";

	DE_ASSERT(isFloatCase || isIntCase || isUintCase || isMatCase);

	// Generate shader.
	// \note For case TYPE_MIXED, vertex position offset and color red component get their values from instance id, while green and blue get their values from instanced attributes.

	string numInstancesStr = de::toString(m_numInstances) + ".0";

	string instanceAttribs;
	string posExpression;
	string colorRExpression;
	string colorGExpression;
	string colorBExpression;

	if (m_instancingType == TYPE_INSTANCE_ID || m_instancingType == TYPE_MIXED)
	{
		posExpression = "a_position + vec4(float(gl_InstanceID) * 2.0 / " + numInstancesStr + ", 0.0, 0.0, 0.0)";
		colorRExpression = "float(gl_InstanceID)/" + numInstancesStr;

		if (m_instancingType == TYPE_INSTANCE_ID)
		{
			colorGExpression = "float(gl_InstanceID)*2.0/" + numInstancesStr;
			colorBExpression = "1.0 - float(gl_InstanceID)/" + numInstancesStr;
		}
	}

	if (m_instancingType == TYPE_ATTRIB_DIVISOR || m_instancingType == TYPE_MIXED)
	{
		if (m_instancingType == TYPE_ATTRIB_DIVISOR)
		{
			posExpression = "a_position + vec4(a_instanceOffset";

			DE_STATIC_ASSERT(OFFSET_COMPONENTS >= 1 && OFFSET_COMPONENTS <= 4);

			for (int i = 0; i < 4-OFFSET_COMPONENTS; i++)
				posExpression += ", 0.0";
			posExpression += ")";

			if (isFloatCase)
				colorRExpression = "a_instanceR" + swizzleFirst;
			else if (isIntCase)
				colorRExpression = "(float(a_instanceR" + swizzleFirst + ") - " + floatIntBiasStr + ") / " + floatIntScaleStr;
			else if (isUintCase)
				colorRExpression = "(float(a_instanceR" + swizzleFirst + ") - " + floatUintBiasStr + ") / " + floatUintScaleStr;
			else if (isMatCase)
				colorRExpression = "a_instanceR[0][0]";
			else
				DE_ASSERT(DE_FALSE);

			instanceAttribs += "in highp " + (OFFSET_COMPONENTS == 1 ? string("float") : "vec" + de::toString(OFFSET_COMPONENTS)) + " a_instanceOffset;\n";
			instanceAttribs += "in mediump " + typeName + " a_instanceR;\n";
		}

		if (isFloatCase)
		{
			colorGExpression = "a_instanceG" + swizzleFirst;
			colorBExpression = "a_instanceB" + swizzleFirst;
		}
		else if (isIntCase)
		{
			colorGExpression = "(float(a_instanceG" + swizzleFirst + ") - " + floatIntBiasStr + ") / " + floatIntScaleStr;
			colorBExpression = "(float(a_instanceB" + swizzleFirst + ") - " + floatIntBiasStr + ") / " + floatIntScaleStr;
		}
		else if (isUintCase)
		{
			colorGExpression = "(float(a_instanceG" + swizzleFirst + ") - " + floatUintBiasStr + ") / " + floatUintScaleStr;
			colorBExpression = "(float(a_instanceB" + swizzleFirst + ") - " + floatUintBiasStr + ") / " + floatUintScaleStr;
		}
		else if (isMatCase)
		{
			colorGExpression = "a_instanceG[0][0]";
			colorBExpression = "a_instanceB[0][0]";
		}
		else
			DE_ASSERT(DE_FALSE);

		instanceAttribs += "in mediump " + typeName + " a_instanceG;\n";
		instanceAttribs += "in mediump " + typeName + " a_instanceB;\n";
	}

	DE_ASSERT(!posExpression.empty());
	DE_ASSERT(!colorRExpression.empty());
	DE_ASSERT(!colorGExpression.empty());
	DE_ASSERT(!colorBExpression.empty());

	std::string vertShaderSourceStr =
		"#version 300 es\n"
		"in highp vec4 a_position;\n" +
		instanceAttribs +
		"out mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = " + posExpression + ";\n"
		"	v_color.r = " + colorRExpression + ";\n"
		"	v_color.g = " + colorGExpression + ";\n"
		"	v_color.b = " + colorBExpression + ";\n"
		"	v_color.a = 1.0;\n"
		"}\n";

	static const char* fragShaderSource =
		"#version 300 es\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"in mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	o_color = v_color;\n"
		"}\n";

	// Create shader program and log it.

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertShaderSourceStr, fragShaderSource));

	tcu::TestLog& log = m_testCtx.getLog();

	log << *m_program;

	if(!m_program->isOk())
		TCU_FAIL("Failed to compile shader");

	// Vertex shader attributes.

	if (m_function == FUNCTION_DRAW_ELEMENTS_INSTANCED)
	{
		// Vertex positions. Positions form a vertical bar of width <screen width>/<number of instances>.

		for (int y = 0; y < QUAD_GRID_SIZE + 1; y++)
			for (int x = 0; x < QUAD_GRID_SIZE + 1; x++)
			{
				float fx = -1.0f + (float)x / (float)QUAD_GRID_SIZE * 2.0f / (float)m_numInstances;
				float fy = -1.0f + (float)y / (float)QUAD_GRID_SIZE * 2.0f;

				m_gridVertexPositions.push_back(fx);
				m_gridVertexPositions.push_back(fy);
			}

		// Indices.

		for (int y = 0; y < QUAD_GRID_SIZE; y++)
			for (int x = 0; x < QUAD_GRID_SIZE; x++)
			{
				int ndx00 = y*(QUAD_GRID_SIZE + 1) + x;
				int ndx10 = y*(QUAD_GRID_SIZE + 1) + x + 1;
				int ndx01 = (y + 1)*(QUAD_GRID_SIZE + 1) + x;
				int ndx11 = (y + 1)*(QUAD_GRID_SIZE + 1) + x + 1;

				// Lower-left triangle of a quad.
				m_gridIndices.push_back((deUint16)ndx00);
				m_gridIndices.push_back((deUint16)ndx10);
				m_gridIndices.push_back((deUint16)ndx01);

				// Upper-right triangle of a quad.
				m_gridIndices.push_back((deUint16)ndx11);
				m_gridIndices.push_back((deUint16)ndx01);
				m_gridIndices.push_back((deUint16)ndx10);
			}
	}
	else
	{
		DE_ASSERT(m_function == FUNCTION_DRAW_ARRAYS_INSTANCED);

		// Vertex positions. Positions form a vertical bar of width <screen width>/<number of instances>.

		for (int y = 0; y < QUAD_GRID_SIZE; y++)
			for (int x = 0; x < QUAD_GRID_SIZE; x++)
			{
				float fx0 = -1.0f + (float)(x+0) / (float)QUAD_GRID_SIZE * 2.0f / (float)m_numInstances;
				float fx1 = -1.0f + (float)(x+1) / (float)QUAD_GRID_SIZE * 2.0f / (float)m_numInstances;
				float fy0 = -1.0f + (float)(y+0) / (float)QUAD_GRID_SIZE * 2.0f;
				float fy1 = -1.0f + (float)(y+1) / (float)QUAD_GRID_SIZE * 2.0f;

				// Vertices of a quad's lower-left triangle: (fx0, fy0), (fx1, fy0) and (fx0, fy1)
				m_gridVertexPositions.push_back(fx0);
				m_gridVertexPositions.push_back(fy0);
				m_gridVertexPositions.push_back(fx1);
				m_gridVertexPositions.push_back(fy0);
				m_gridVertexPositions.push_back(fx0);
				m_gridVertexPositions.push_back(fy1);

				// Vertices of a quad's upper-right triangle: (fx1, fy1), (fx0, fy1) and (fx1, fy0)
				m_gridVertexPositions.push_back(fx1);
				m_gridVertexPositions.push_back(fy1);
				m_gridVertexPositions.push_back(fx0);
				m_gridVertexPositions.push_back(fy1);
				m_gridVertexPositions.push_back(fx1);
				m_gridVertexPositions.push_back(fy0);
			}
	}

	// Instanced attributes: position offset and color RGB components.

	if (m_instancingType == TYPE_ATTRIB_DIVISOR || m_instancingType == TYPE_MIXED)
	{
		if (m_instancingType == TYPE_ATTRIB_DIVISOR)
		{
			// Offsets are such that the vertical bars are drawn next to each other.
			for (int i = 0; i < m_numInstances; i++)
			{
				m_instanceOffsets.push_back((float)i * 2.0f / (float)m_numInstances);

				DE_STATIC_ASSERT(OFFSET_COMPONENTS >= 1 && OFFSET_COMPONENTS <= 4);

				for (int j = 0; j < OFFSET_COMPONENTS-1; j++)
					m_instanceOffsets.push_back(0.0f);
			}

			int rInstances = m_numInstances / ATTRIB_DIVISOR_R + (m_numInstances % ATTRIB_DIVISOR_R == 0 ? 0 : 1);
			for (int i = 0; i < rInstances; i++)
			{
				pushVarCompAttrib(m_instanceColorR, (float)i / (float)rInstances);

				for (int j = 0; j < typeSize - 1; j++)
					pushVarCompAttrib(m_instanceColorR, 0.0f);
			}
		}

		int gInstances = m_numInstances / ATTRIB_DIVISOR_G + (m_numInstances % ATTRIB_DIVISOR_G == 0 ? 0 : 1);
		for (int i = 0; i < gInstances; i++)
		{
			pushVarCompAttrib(m_instanceColorG, (float)i*2.0f / (float)gInstances);

			for (int j = 0; j < typeSize - 1; j++)
				pushVarCompAttrib(m_instanceColorG, 0.0f);
		}

		int bInstances = m_numInstances / ATTRIB_DIVISOR_B + (m_numInstances % ATTRIB_DIVISOR_B == 0 ? 0 : 1);
		for (int i = 0; i < bInstances; i++)
		{
			pushVarCompAttrib(m_instanceColorB, 1.0f - (float)i / (float)bInstances);

			for (int j = 0; j < typeSize - 1; j++)
				pushVarCompAttrib(m_instanceColorB, 0.0f);
		}
	}
}